

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeVMOVSRR(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  void *Decoder_00;
  uint64_t Address_00;
  uint64_t Address_01;
  uint64_t Address_02;
  uint RegNo;
  
  Decoder_00 = (void *)(ulong)(Insn & 0xf);
  RegNo = (Insn >> 5 & 1) + (Insn & 0xf) * 2;
  DVar1 = DecodeSPRRegisterClass(Inst,RegNo,Address,Decoder_00);
  if (((((DVar1 == MCDisassembler_Success) || (DVar1 == MCDisassembler_SoftFail)) &&
       ((DVar1 = DecodeSPRRegisterClass(Inst,RegNo + 1,0,Decoder_00),
        DVar1 == MCDisassembler_Success || (DVar1 == MCDisassembler_SoftFail)))) &&
      ((DVar1 = DecodeGPRRegisterClass(Inst,Insn >> 0xc & 0xf,Address_00,Decoder_00),
       DVar1 == MCDisassembler_Success || (DVar1 == MCDisassembler_SoftFail)))) &&
     ((DVar1 = DecodeGPRRegisterClass(Inst,Insn >> 0x10 & 0xf,Address_01,Decoder_00),
      DVar1 == MCDisassembler_Success || (DVar1 == MCDisassembler_SoftFail)))) {
    DVar1 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_02,Decoder_00);
    DVar1 = (*(code *)(&DAT_001ca050 + *(int *)(&DAT_001ca050 + (ulong)DVar1 * 4)))();
    return DVar1;
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeVMOVSRR(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rt  = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rt2 = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm  = fieldFromInstruction_4(Insn,  5, 1);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	Rm |= fieldFromInstruction_4(Insn, 0, 4) << 1;

	if (Rt == 0xF || Rt2 == 0xF || Rm == 0x1F)
		S = MCDisassembler_SoftFail;

	if (!Check(&S, DecodeSPRRegisterClass(Inst, Rm  , Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeSPRRegisterClass(Inst, Rm+1, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt  , Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt2 , Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}